

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

void edition_unittest::TestNestedMessageHasBits::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  TestNestedMessageHasBits **v1;
  TestNestedMessageHasBits **v2;
  char *failure_msg;
  LogMessage *pLVar2;
  uint32_t *puVar3;
  TestNestedMessageHasBits_NestedMessage *pTVar4;
  LogMessage local_90;
  Voidify local_79;
  uint local_78;
  uint32_t cached_has_bits;
  LogMessage local_68;
  Voidify local_51;
  TestNestedMessageHasBits *local_50;
  Nullable<const_char_*> local_48;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Arena *arena;
  TestNestedMessageHasBits *from;
  TestNestedMessageHasBits *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  Nullable<const_char_*> local_10;
  
  arena = (Arena *)from_msg;
  from = (TestNestedMessageHasBits *)to_msg;
  _this = (TestNestedMessageHasBits *)from_msg;
  from_msg_local = to_msg;
  absl_log_internal_check_op_result =
       (Nullable<const_char_*>)google::protobuf::MessageLite::GetArena(to_msg);
  local_50 = (TestNestedMessageHasBits *)arena;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<edition_unittest::TestNestedMessageHasBits_const*>(&local_50);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<edition_unittest::TestNestedMessageHasBits*>(&from);
  local_48 = absl::lts_20250127::log_internal::
             Check_NEImpl<edition_unittest::TestNestedMessageHasBits_const*,edition_unittest::TestNestedMessageHasBits*>
                       (v1,v2,"&from != _this");
  if (local_48 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_48);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
               ,0x67a7,failure_msg);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_68);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_51,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_68);
  }
  local_78 = 0;
  puVar3 = google::protobuf::internal::HasBits<1>::operator[]
                     ((HasBits<1> *)&(arena->impl_).field_0x10,0);
  local_78 = *puVar3;
  if ((local_78 & 1) != 0) {
    if ((arena->impl_).mutex_.mu_.super___atomic_base<long>._M_i == 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_90,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
                 ,0x67ad,"from._impl_.optional_nested_message_ != nullptr");
      pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_90);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_79,pLVar2);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_90);
    }
    if ((from->field_0)._impl_.optional_nested_message_ ==
        (TestNestedMessageHasBits_NestedMessage *)0x0) {
      to_msg_local = (MessageLite *)(arena->impl_).mutex_.mu_.super___atomic_base<long>._M_i;
      local_10 = absl_log_internal_check_op_result;
      pTVar4 = (TestNestedMessageHasBits_NestedMessage *)
               google::protobuf::Arena::
               CopyConstruct<edition_unittest::TestNestedMessageHasBits_NestedMessage>
                         ((Arena *)absl_log_internal_check_op_result,to_msg_local);
      (from->field_0)._impl_.optional_nested_message_ = pTVar4;
    }
    else {
      TestNestedMessageHasBits_NestedMessage::MergeFrom
                ((from->field_0)._impl_.optional_nested_message_,
                 (TestNestedMessageHasBits_NestedMessage *)
                 (arena->impl_).mutex_.mu_.super___atomic_base<long>._M_i);
    }
  }
  uVar1 = local_78;
  puVar3 = google::protobuf::internal::HasBits<1>::operator[](&(from->field_0)._impl_._has_bits_,0);
  *puVar3 = uVar1 | *puVar3;
  google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)&(arena->impl_).alloc_policy_);
  return;
}

Assistant:

void TestNestedMessageHasBits::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestNestedMessageHasBits*>(&to_msg);
  auto& from = static_cast<const TestNestedMessageHasBits&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:edition_unittest.TestNestedMessageHasBits)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000001u) != 0) {
    ABSL_DCHECK(from._impl_.optional_nested_message_ != nullptr);
    if (_this->_impl_.optional_nested_message_ == nullptr) {
      _this->_impl_.optional_nested_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.optional_nested_message_);
    } else {
      _this->_impl_.optional_nested_message_->MergeFrom(*from._impl_.optional_nested_message_);
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}